

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O2

bool __thiscall hwnet::ThreadPool::TaskQueue::Get(TaskQueue *this,taskque *out)

{
  mutex *__mutex;
  _Elt_pointer psVar1;
  _Elt_pointer psVar2;
  bool bVar3;
  
  __mutex = &this->mtx;
  std::mutex::lock(__mutex);
  while( true ) {
    psVar1 = (this->tasks).
             super__Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    psVar2 = (this->tasks).
             super__Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if (this->closed == true) break;
    if (psVar1 != psVar2) goto LAB_0011d4a8;
    this->watting = this->watting + 1;
    std::_V2::condition_variable_any::wait<std::mutex>(&this->cv,__mutex);
    this->watting = this->watting + -1;
  }
  if (psVar1 == psVar2) {
    bVar3 = false;
  }
  else {
LAB_0011d4a8:
    std::
    swap<std::_Deque_base<std::shared_ptr<hwnet::Task>,std::allocator<std::shared_ptr<hwnet::Task>>>::_Deque_impl_data>
              ((_Deque_impl_data *)&this->tasks,(_Deque_impl_data *)out);
    bVar3 = true;
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return bVar3;
}

Assistant:

bool ThreadPool::TaskQueue::Get(ThreadPool::TaskQueue::taskque &out) {
	std::lock_guard<std::mutex> guard(this->mtx);
	for( ; ;) {
		if(this->closed) {
			if(this->tasks.empty()) {
				return false;
			} else {
				this->tasks.swap(out);
				return true;
			}
		} else {
			if(this->tasks.empty()) {
				++this->watting;//增加等待数量
				this->cv.wait(this->mtx);
				--this->watting;//减少正在等待的线程数量
			} else {
				this->tasks.swap(out);
				return true;
			}	
		}
	}
}